

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

cmMakefile * cmakemainGetMakefile(void *clientdata)

{
  bool bVar1;
  cmGlobalGenerator *this;
  cmGlobalGenerator *gg;
  cmake *cm;
  void *clientdata_local;
  
  if (((clientdata == (void *)0x0) || (bVar1 = cmake::GetDebugOutput((cmake *)clientdata), !bVar1))
     || (this = cmake::GetGlobalGenerator((cmake *)clientdata), this == (cmGlobalGenerator *)0x0)) {
    clientdata_local = (void *)0x0;
  }
  else {
    clientdata_local = cmGlobalGenerator::GetCurrentMakefile(this);
  }
  return (cmMakefile *)clientdata_local;
}

Assistant:

static cmMakefile* cmakemainGetMakefile(void* clientdata)
{
  cmake* cm = (cmake*)clientdata;
  if (cm && cm->GetDebugOutput()) {
    cmGlobalGenerator* gg = cm->GetGlobalGenerator();
    if (gg) {
      return gg->GetCurrentMakefile();
    }
  }
  return CM_NULLPTR;
}